

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

bool __thiscall UtestShell::match(UtestShell *this,char *target,TestFilter *filters)

{
  bool bVar1;
  bool bVar2;
  SimpleString SStack_38;
  
  if (filters == (TestFilter *)0x0) {
    bVar2 = true;
  }
  else {
    for (; bVar2 = filters != (TestFilter *)0x0, bVar2; filters = TestFilter::getNext(filters)) {
      SimpleString::SimpleString(&SStack_38,target);
      bVar1 = TestFilter::match(filters,&SStack_38);
      SimpleString::~SimpleString(&SStack_38);
      if (bVar1) {
        return bVar2;
      }
    }
  }
  return bVar2;
}

Assistant:

bool UtestShell::match(const char* target, const TestFilter* filters) const
{
    if(filters == NULLPTR) return true;

    for(; filters != NULLPTR; filters = filters->getNext())
        if(filters->match(target)) return true;

    return false;
}